

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatData
                (String *sb,FormatFlags formatFlags,Arch arch,TypeId typeId,void *data,
                size_t itemCount,size_t repeatCount)

{
  byte bVar1;
  uint uVar2;
  Error EVar3;
  Error EVar4;
  Error EVar5;
  ulong uVar6;
  uint64_t i;
  uint uVar7;
  long lVar8;
  long lVar10;
  bool bVar11;
  ulong uVar9;
  
  if (arch < (kMIPS64_BE|k32BitMask)) {
    bVar1 = TypeUtils::_typeData[(ulong)typeId + 0x100];
    if (bVar1 == 0) {
      EVar3 = 3;
    }
    else {
      uVar2 = (uint)bVar1;
      bVar11 = (uVar2 & bVar1 - 1) == 0;
      uVar6 = 1;
      if (bVar11) {
        uVar6 = (ulong)uVar2;
      }
      uVar7 = (uint)uVar6;
      uVar9 = 1;
      if (!bVar11) {
        uVar9 = (ulong)uVar2;
      }
      lVar8 = uVar9 * itemCount;
      if (8 < uVar7) {
        do {
          uVar7 = (uint)(uVar6 >> 1);
          lVar8 = lVar8 * 2;
          uVar2 = (uint)uVar6;
          uVar6 = uVar6 >> 1;
        } while (0x11 < uVar2);
      }
      uVar2 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      bVar1 = *(byte *)((ulong)uVar2 + (ulong)arch * 0xd8 + 0x14e0d4);
      if ((repeatCount < 2) || (EVar3 = String::_opFormat(sb,kAppend,".repeat %zu "), EVar3 == 0)) {
        String::_opChar(sb,kAppend,'.');
        String::_opString(sb,kAppend,&wordNameTable + (ulong)bVar1 * 8,0xffffffffffffffff);
        String::_opChar(sb,kAppend,' ');
        if (lVar8 != 0) {
          lVar10 = 0;
          EVar3 = 1;
          do {
            if ((lVar10 == 0) || (EVar4 = String::_opString(sb,kAppend,", ",2), EVar4 == 0)) {
              i = 0;
              switch(uVar7) {
              case 1:
                i = (uint64_t)(byte)*data;
                break;
              case 2:
                i = (uint64_t)(ushort)*data;
                break;
              case 4:
                i = (uint64_t)(uint)*data;
                break;
              case 8:
                i = *data;
              }
              EVar5 = String::_opNumber(sb,kAppend,i,0x10,(ulong)(uVar7 * 2),kAlternate);
              bVar11 = EVar5 == 0;
              EVar4 = EVar3;
              if (!bVar11) {
                EVar4 = EVar5;
              }
              uVar6 = 0;
              if (bVar11) {
                uVar6 = (ulong)uVar7;
              }
              data = (void *)((long)data + uVar6);
            }
            else {
              bVar11 = false;
            }
            if (!bVar11) {
              return EVar4;
            }
            lVar10 = lVar10 + 1;
            EVar3 = EVar4;
          } while (lVar8 != lVar10);
        }
        EVar3 = 0;
      }
    }
  }
  else {
    EVar3 = 4;
  }
  return EVar3;
}

Assistant:

Error formatData(
  String& sb,
  FormatFlags formatFlags,
  Arch arch,
  TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) noexcept
{
  DebugUtils::unused(formatFlags);

  if (ASMJIT_UNLIKELY(!Environment::isDefinedArch(arch)))
    return DebugUtils::errored(kErrorInvalidArch);

  uint32_t typeSize = TypeUtils::sizeOf(typeId);
  if (typeSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (!Support::isPowerOf2(typeSize)) {
    itemCount *= typeSize;
    typeSize = 1;
  }

  while (typeSize > 8u) {
    typeSize >>= 1;
    itemCount <<= 1;
  }

  uint32_t typeSizeLog2 = Support::ctz(typeSize);
  const char* wordName = wordNameTable[size_t(ArchTraits::byArch(arch).typeNameIdByIndex(typeSizeLog2))];

  if (repeatCount > 1)
    ASMJIT_PROPAGATE(sb.appendFormat(".repeat %zu ", repeatCount));

  return formatDataHelper(sb, wordName, typeSize, static_cast<const uint8_t*>(data), itemCount);
}